

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O1

bool __thiscall Clasp::SharedContext::attach(SharedContext *this,Solver *other)

{
  uint32 *puVar1;
  uint32 numConsGuess;
  Solver *pSVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  SolverParams *params;
  undefined4 extraout_var;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  Literal x;
  Antecedent null;
  Literal local_3c;
  Antecedent local_38;
  Constraint *pCVar7;
  
  if ((this->step_).rep_ >> 2 <= (other->assign_).assign_.ebo_.size - 1) {
    bVar5 = Solver::popRootLevel(other,(other->levels_).root,(LitVec *)0x0,true);
    if (!bVar5) {
      return false;
    }
    if (*(this->solvers_).ebo_.buf == other) {
      return true;
    }
  }
  initStats(this,other);
  uVar11 = (other->assign_).assign_.ebo_.size;
  numConsGuess = ((*(this->solvers_).ebo_.buf)->constraints_).ebo_.size;
  plVar10 = (long *)((this->config_).ptr_ & 0xfffffffffffffffe);
  params = (SolverParams *)(**(code **)(*plVar10 + 0x30))(plVar10,(ulong)other->strategy_ >> 0x3a);
  Solver::startInit(other,numConsGuess,params);
  if ((other->conflict_).ebo_.size == 0) {
    local_38.data_ = 0;
    uVar9 = (ulong)((*(this->solvers_).ebo_.buf)->assign_).trail.ebo_.size;
    if (uVar9 != 0) {
      uVar12 = 0;
      do {
        pSVar2 = *(this->solvers_).ebo_.buf;
        local_3c.rep_ = (pSVar2->assign_).trail.ebo_.buf[uVar12].rep_;
        bVar5 = false;
        if (local_3c.rep_ >> 2 <= (pSVar2->shared_->varInfo_).ebo_.size - 1) {
          bVar5 = Solver::force(other,&local_3c,&local_38);
          bVar5 = !bVar5;
        }
        if (bVar5) {
          return false;
        }
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    if ((this->satPrepro).ptr_ < 2) {
      uVar11 = 0x40000000;
    }
    pSVar2 = *(this->solvers_).ebo_.buf;
    uVar8 = (pSVar2->assign_).assign_.ebo_.size - 1;
    if (uVar11 <= uVar8) {
      puVar3 = (pSVar2->assign_).assign_.ebo_.buf;
      puVar4 = (other->assign_).assign_.ebo_.buf;
      do {
        if (((0xffffffef < puVar3[uVar11]) && ((puVar4[uVar11] & 3) == 0)) &&
           (puVar4[uVar11] < 0xfffffff0)) {
          puVar4[uVar11] = 0xfffffff1;
          puVar1 = &(other->assign_).elims_;
          *puVar1 = *puVar1 + 1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 <= uVar8);
    }
    if ((other->constraints_).ebo_.size == 0) {
      *(uint *)&other->field_0x204 =
           *(uint *)&other->field_0x204 & 0xc0000000 | *(uint *)&pSVar2->field_0x204 & 0x3fffffff;
    }
    bVar5 = Solver::cloneDB(other,&(*(this->solvers_).ebo_.buf)->constraints_);
    if (bVar5) {
      pCVar7 = (*(this->solvers_).ebo_.buf)->enum_;
      if (pCVar7 == (Constraint *)0x0) {
        pCVar7 = (Constraint *)0x0;
      }
      else {
        iVar6 = (*pCVar7->_vptr_Constraint[2])(pCVar7,other);
        pCVar7 = (Constraint *)CONCAT44(extraout_var,iVar6);
      }
      Solver::setEnumerationConstraint(other,pCVar7);
      bVar5 = Solver::preparePost(other);
      if ((bVar5) && (bVar5 = Solver::endInit(other), bVar5)) {
        return true;
      }
      Solver::setEnumerationConstraint(other,(Constraint *)0x0);
      Solver::popAuxVar(other,0xffffffff,(ConstraintDB *)0x0);
      return false;
    }
  }
  return false;
}

Assistant:

bool SharedContext::attach(Solver& other) {
	assert(frozen() && other.shared_ == this);
	if (other.validVar(step_.var())) {
		if (!other.popRootLevel(other.rootLevel())){ return false; }
		if (&other == master())                    { return true;  }
	}
	initStats(other);
	// 1. clone vars & assignment
	Var lastVar = other.numVars();
	other.startInit(static_cast<uint32>(master()->constraints_.size()), configuration()->solver(other.id()));
	if (other.hasConflict()) { return false; }
	Antecedent null;
	for (LitVec::size_type i = 0, end = master()->trail().size(); i != end; ++i) {
		Literal x = master()->trail()[i];
		if (master()->auxVar(x.var())) { continue;  }
		if (!other.force(x, null))     { return false; }
	}
	for (Var v = satPrepro.get() ? lastVar+1 : varMax, end = master()->numVars(); v <= end; ++v) {
		if (eliminated(v) && other.value(v) == value_free) {
			other.assign_.eliminate(v);
		}
	}
	if (other.constraints_.empty()) { other.lastSimp_ = master()->lastSimp_; }
	// 2. clone & attach constraints
	if (!other.cloneDB(master()->constraints_)) { return false; }
	Constraint* c = master()->enumerationConstraint();
	other.setEnumerationConstraint( c ? c->cloneAttach(other) : 0 );
	// 3. endInit
	return (other.preparePost() && other.endInit()) || (detach(other, false), false);
}